

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ProceduralBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  Info *pIVar1;
  size_t sVar2;
  pointer ppAVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ProceduralBlockSyntax *pPVar10;
  long lVar11;
  
  pPVar10 = (ProceduralBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProceduralBlockSyntax *)this->endPtr < pPVar10 + 1) {
    pPVar10 = (ProceduralBlockSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pPVar10 + 1);
  }
  TVar6 = args_2->kind;
  uVar7 = args_2->field_0x2;
  NVar8.raw = (args_2->numFlags).raw;
  uVar9 = args_2->rawLen;
  pIVar1 = args_2->info;
  (pPVar10->super_MemberSyntax).super_SyntaxNode.kind = *args;
  (pPVar10->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar10->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args_1->super_SyntaxListBase).childCount;
  sVar2 = (args_1->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pPVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args_1->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr
  ;
  (pPVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f85e0;
  (pPVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pPVar10;
  sVar2 = (pPVar10->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppAVar3 = (pPVar10->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar11 = 0;
    do {
      *(ProceduralBlockSyntax **)(*(long *)((long)ppAVar3 + lVar11) + 8) = pPVar10;
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
  }
  (pPVar10->keyword).kind = TVar6;
  (pPVar10->keyword).field_0x2 = uVar7;
  (pPVar10->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pPVar10->keyword).rawLen = uVar9;
  (pPVar10->keyword).info = pIVar1;
  (pPVar10->statement).ptr = args_3;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pPVar10;
  return pPVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }